

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

size_type cmGeneratorExpression::Find(string *input)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = std::__cxx11::string::find((char *)input,0x4f1e9c,0);
  if ((uVar1 != 0xffffffffffffffff) &&
     (lVar2 = std::__cxx11::string::find((char *)input,0x4ec602,uVar1), lVar2 != -1)) {
    return uVar1;
  }
  return 0xffffffffffffffff;
}

Assistant:

std::string::size_type cmGeneratorExpression::Find(const std::string &input)
{
  const std::string::size_type openpos = input.find("$<");
  if (openpos != std::string::npos
      && input.find(">", openpos) != std::string::npos)
    {
    return openpos;
    }
  return std::string::npos;
}